

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O1

bool __thiscall Opcode::AABBNoLeafTree::Refit(AABBNoLeafTree *this,MeshInterface *mesh_interface)

{
  udword uVar1;
  AABBNoLeafNode *pAVar2;
  float *pfVar3;
  IndexedTriangle *pIVar4;
  Point *pPVar5;
  ulong uVar6;
  long lVar7;
  CollisionAABB *CurrentBox;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if ((mesh_interface != (MeshInterface *)0x0) &&
     (uVar6 = (ulong)(this->super_AABBOptimizedTree).mNbNodes, uVar6 != 0)) {
    pAVar2 = this->mNodes;
    lVar7 = uVar6 * 0x28;
    do {
      pfVar3 = *(float **)((long)pAVar2 + lVar7 + -0x10);
      if (((ulong)pfVar3 & 1) == 0) {
        fVar10 = *pfVar3 - pfVar3[3];
        fVar11 = pfVar3[1] - pfVar3[4];
        fVar14 = pfVar3[2] - pfVar3[5];
        fVar12 = *pfVar3 + pfVar3[3];
        fVar13 = pfVar3[1] + pfVar3[4];
        fVar16 = pfVar3[2] + pfVar3[5];
      }
      else {
        uVar6 = (ulong)((int)((ulong)pfVar3 >> 1) * mesh_interface->mTriStride);
        pIVar4 = mesh_interface->mTris;
        pPVar5 = mesh_interface->mVerts;
        uVar1 = mesh_interface->mVertexStride;
        uVar8 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar6) * uVar1);
        uVar9 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar6 + 4) * uVar1);
        uVar6 = (ulong)(uVar1 * *(int *)((long)pIVar4->mVRef + uVar6 + 8));
        fVar11 = *(float *)((long)&pPVar5->x + uVar8);
        fVar21 = *(float *)((long)&pPVar5->y + uVar8);
        fVar15 = *(float *)((long)&pPVar5->x + uVar9);
        fVar16 = *(float *)((long)&pPVar5->y + uVar9);
        fVar10 = fVar11;
        if (fVar15 <= fVar11) {
          fVar10 = fVar15;
        }
        fVar12 = *(float *)((long)&pPVar5->x + uVar6);
        fVar13 = *(float *)((long)&pPVar5->y + uVar6);
        if (fVar12 <= fVar10) {
          fVar10 = fVar12;
        }
        if (fVar15 <= fVar11) {
          fVar15 = fVar11;
        }
        if (fVar12 <= fVar15) {
          fVar12 = fVar15;
        }
        fVar11 = fVar21;
        if (fVar16 <= fVar21) {
          fVar11 = fVar16;
        }
        if (fVar13 <= fVar11) {
          fVar11 = fVar13;
        }
        if (fVar16 <= fVar21) {
          fVar16 = fVar21;
        }
        if (fVar13 <= fVar16) {
          fVar13 = fVar16;
        }
        fVar21 = *(float *)((long)&pPVar5->z + uVar8);
        fVar15 = *(float *)((long)&pPVar5->z + uVar9);
        fVar16 = *(float *)((long)&pPVar5->z + uVar6);
        fVar14 = fVar21;
        if (fVar15 <= fVar21) {
          fVar14 = fVar15;
        }
        if (fVar16 <= fVar14) {
          fVar14 = fVar16;
        }
        if (fVar15 <= fVar21) {
          if (fVar16 <= fVar21) {
            fVar16 = fVar21;
          }
        }
        else if (fVar16 <= fVar15) {
          fVar16 = fVar15;
        }
      }
      pfVar3 = *(float **)((long)pAVar2 + lVar7 + -8);
      if (((ulong)pfVar3 & 1) == 0) {
        fVar20 = *pfVar3 - pfVar3[3];
        fVar21 = pfVar3[1] - pfVar3[4];
        fVar23 = pfVar3[2] - pfVar3[5];
        fVar17 = *pfVar3 + pfVar3[3];
        fVar18 = pfVar3[1] + pfVar3[4];
        fVar19 = pfVar3[2] + pfVar3[5];
      }
      else {
        uVar6 = (ulong)((int)((ulong)pfVar3 >> 1) * mesh_interface->mTriStride);
        pIVar4 = mesh_interface->mTris;
        pPVar5 = mesh_interface->mVerts;
        uVar1 = mesh_interface->mVertexStride;
        uVar8 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar6) * uVar1);
        uVar9 = (ulong)(*(int *)((long)pIVar4->mVRef + uVar6 + 4) * uVar1);
        uVar6 = (ulong)(uVar1 * *(int *)((long)pIVar4->mVRef + uVar6 + 8));
        fVar21 = *(float *)((long)&pPVar5->x + uVar8);
        fVar15 = *(float *)((long)&pPVar5->y + uVar8);
        fVar22 = *(float *)((long)&pPVar5->x + uVar9);
        fVar19 = *(float *)((long)&pPVar5->y + uVar9);
        fVar20 = fVar21;
        if (fVar22 <= fVar21) {
          fVar20 = fVar22;
        }
        fVar17 = *(float *)((long)&pPVar5->x + uVar6);
        fVar18 = *(float *)((long)&pPVar5->y + uVar6);
        if (fVar17 <= fVar20) {
          fVar20 = fVar17;
        }
        if (fVar22 <= fVar21) {
          fVar22 = fVar21;
        }
        if (fVar17 <= fVar22) {
          fVar17 = fVar22;
        }
        fVar21 = fVar15;
        if (fVar19 <= fVar15) {
          fVar21 = fVar19;
        }
        if (fVar18 <= fVar21) {
          fVar21 = fVar18;
        }
        if (fVar19 <= fVar15) {
          fVar19 = fVar15;
        }
        if (fVar18 <= fVar19) {
          fVar18 = fVar19;
        }
        fVar15 = *(float *)((long)&pPVar5->z + uVar8);
        fVar22 = *(float *)((long)&pPVar5->z + uVar9);
        fVar19 = *(float *)((long)&pPVar5->z + uVar6);
        fVar23 = fVar15;
        if (fVar22 <= fVar15) {
          fVar23 = fVar22;
        }
        if (fVar19 <= fVar23) {
          fVar23 = fVar19;
        }
        if (fVar22 <= fVar15) {
          if (fVar19 <= fVar15) {
            fVar19 = fVar15;
          }
        }
        else if (fVar19 <= fVar22) {
          fVar19 = fVar22;
        }
      }
      if (fVar19 <= fVar16) {
        fVar19 = fVar16;
      }
      if (fVar23 <= fVar14) {
        fVar14 = fVar23;
      }
      if (fVar18 <= fVar13) {
        fVar18 = fVar13;
      }
      if (fVar21 <= fVar11) {
        fVar11 = fVar21;
      }
      if (fVar17 <= fVar12) {
        fVar17 = fVar12;
      }
      if (fVar20 <= fVar10) {
        fVar10 = fVar20;
      }
      *(float *)((long)&pAVar2[-1].mAABB.mCenter.x + lVar7) = (fVar10 + fVar17) * 0.5;
      *(float *)((long)pAVar2 + lVar7 + -0x24) = (fVar11 + fVar18) * 0.5;
      *(float *)((long)pAVar2 + lVar7 + -0x20) = (fVar14 + fVar19) * 0.5;
      *(float *)((long)pAVar2 + lVar7 + -0x1c) = (fVar17 - fVar10) * 0.5;
      *(float *)((long)pAVar2 + lVar7 + -0x18) = (fVar18 - fVar11) * 0.5;
      *(float *)((long)pAVar2 + lVar7 + -0x14) = (fVar19 - fVar14) * 0.5;
      lVar7 = lVar7 + -0x28;
    } while (lVar7 != 0);
  }
  return mesh_interface != (MeshInterface *)0x0;
}

Assistant:

bool AABBNoLeafTree::Refit(const MeshInterface* mesh_interface)
{
	// Checkings
	if(!mesh_interface)	return false;

	// Bottom-up update
	VertexPointers VP;
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mNbNodes;
	while(Index--)
	{
		AABBNoLeafNode& Current = mNodes[Index];

		if(Current.HasPosLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetPosPrimitive());
			ComputeMinMax(Min, Max, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetPos()->mAABB;
			CurrentBox.GetMin(Min);
			CurrentBox.GetMax(Max);
		}

		if(Current.HasNegLeaf())
		{
			mesh_interface->GetTriangle(VP, Current.GetNegPrimitive());
			ComputeMinMax(Min_, Max_, VP);
		}
		else
		{
			const CollisionAABB& CurrentBox = Current.GetNeg()->mAABB;
			CurrentBox.GetMin(Min_);
			CurrentBox.GetMax(Max_);
		}
#ifdef OPC_USE_FCOMI
		Min.x = FCMin2(Min.x, Min_.x);
		Max.x = FCMax2(Max.x, Max_.x);
		Min.y = FCMin2(Min.y, Min_.y);
		Max.y = FCMax2(Max.y, Max_.y);
		Min.z = FCMin2(Min.z, Min_.z);
		Max.z = FCMax2(Max.z, Max_.z);
#else
		Min.Min(Min_);
		Max.Max(Max_);
#endif
		Current.mAABB.SetMinMax(Min, Max);
	}
	return true;
}